

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O1

void __thiscall
soplex::SPxSolverBase<double>::getLeaveVals2
          (SPxSolverBase<double> *this,double leaveMax,SPxId enterId,double *enterBound,
          double *newUBbound,double *newLBbound,double *newCoPrhs,StableSum<double> *objChange)

{
  SPxBasisBase<double> *this_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  Status SVar5;
  VectorBase<double> *pVVar6;
  Status *pSVar7;
  pointer pdVar8;
  ostream *poVar9;
  undefined8 *puVar10;
  long lVar11;
  long in_FS_OFFSET;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  DataKey local_58;
  long local_50;
  undefined1 local_48 [16];
  DataKey local_38;
  
  this_00 = &this->super_SPxBasisBase<double>;
  *enterBound = 0.0;
  local_38.info = enterId.super_DataKey.info;
  local_38 = enterId.super_DataKey;
  if (local_38.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    switch((this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11]) {
    case D_FREE:
      pVVar6 = &this->theURbound;
      if (leaveMax *
          (this->thePvec->thedelta).super_VectorBase<double>.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar11] < 0.0) {
        pVVar6 = &this->theLRbound;
      }
      *newCoPrhs = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      ::soplex::infinity::__tls_init();
      dVar2 = *(double *)(in_FS_OFFSET + -8);
      *newUBbound = dVar2;
      ::soplex::infinity::__tls_init();
      *newLBbound = -dVar2;
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      goto LAB_001c1125;
    case D_ON_UPPER:
      goto switchD_001c0d29_caseD_2;
    case D_ON_LOWER:
code_r0x001c12bf:
      ::soplex::infinity::__tls_init();
      *newUBbound = *(double *)(in_FS_OFFSET + -8);
      *newLBbound = 0.0;
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = P_ON_UPPER;
      pdVar8 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001c12f8;
    case D_ON_BOTH:
      if (0.0 <= leaveMax *
                 (this->thePvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11]) goto code_r0x001c12bf;
      goto switchD_001c0d29_caseD_2;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE54 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR! Tried to put a fixed row variable into the basis: ",
                 0x39);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", lhs=",6);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", rhs=",6);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::endl<char,std::char_traits<char>>(poVar9);
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE05 This should never happen.","");
      *puVar10 = &PTR__SPxException_006a9ee8;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar10 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE06 This should never happen.","");
      *puVar10 = &PTR__SPxException_006a9ee8;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar10 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = SVar5;
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      if (dVar2 < *(double *)(in_FS_OFFSET + -8)) {
        (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
      }
      *newCoPrhs = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      uVar3 = *(uint *)((long)pdVar8 + 4);
      *(undefined4 *)newLBbound = *(undefined4 *)pdVar8;
      *(uint *)((long)newLBbound + 4) = uVar3 ^ 0x80000000;
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar3 = *(uint *)((long)(pdVar8 + lVar11) + 4);
      *(undefined4 *)newUBbound = *(undefined4 *)(pdVar8 + lVar11);
      *(uint *)((long)newUBbound + 4) = uVar3 ^ 0x80000000;
      break;
    case P_ON_UPPER:
      SVar5 = SPxBasisBase<double>::dualRowStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = SVar5;
      dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      if (-*(double *)(in_FS_OFFSET + -8) < dVar2) {
        (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
      }
      *newCoPrhs = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + lVar11;
      uVar3 = *(uint *)((long)pdVar8 + 4);
      *(undefined4 *)newUBbound = *(undefined4 *)pdVar8;
      *(uint *)((long)newUBbound + 4) = uVar3 ^ 0x80000000;
      pdVar8 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar3 = *(uint *)((long)(pdVar8 + lVar11) + 4);
      *(undefined4 *)newLBbound = *(undefined4 *)(pdVar8 + lVar11);
      *(uint *)((long)newLBbound + 4) = uVar3 ^ 0x80000000;
      break;
    case P_FREE:
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE04 This should never happen.","");
      *puVar10 = &PTR__SPxException_006a9ee8;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar10 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    *enterBound = -pdVar8[lVar11];
    dVar2 = objChange->sum;
    dVar14 = dVar2 - *newCoPrhs * pdVar8[lVar11];
    objChange->c = (-(*newCoPrhs * pdVar8[lVar11]) - (dVar14 - dVar2)) +
                   (dVar2 - (dVar14 - (dVar14 - dVar2))) + objChange->c;
  }
  else {
    SPxColId::SPxColId((SPxColId *)&local_58,(SPxId *)&local_38);
    iVar4 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set,&local_58);
    lVar11 = (long)iVar4;
    switch((this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11]) {
    case D_FREE:
      ::soplex::infinity::__tls_init();
      dVar2 = *(double *)(in_FS_OFFSET + -8);
      *newUBbound = dVar2;
      ::soplex::infinity::__tls_init();
      *newLBbound = -dVar2;
      *newCoPrhs = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
LAB_001c1125:
      pSVar7[lVar11] = P_FIXED;
      return;
    case D_ON_LOWER:
code_r0x001c0e5a:
      ::soplex::infinity::__tls_init();
      *newUBbound = *(double *)(in_FS_OFFSET + -8);
      *newLBbound = 0.0;
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = P_ON_UPPER;
      pdVar8 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      goto LAB_001c12f8;
    case D_ON_BOTH:
      if (0.0 <= leaveMax *
                 (this->theCoPvec->thedelta).super_VectorBase<double>.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11]) goto code_r0x001c0e5a;
    case D_ON_UPPER:
      *newUBbound = 0.0;
      ::soplex::infinity::__tls_init();
      *newLBbound = -*(double *)(in_FS_OFFSET + -8);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = P_ON_LOWER;
      pdVar8 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_001c12f8:
      *newCoPrhs = pdVar8[lVar11];
      return;
    case P_FIXED:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ELEAVE56 ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR! Tried to put a fixed column variable into the basis. ",0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"idx=",4);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", lower=",8);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", upper=",8);
      poVar9 = std::ostream::_M_insert<double>
                         ((this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11]);
      std::endl<char,std::char_traits<char>>(poVar9);
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE07 This should never happen.","");
      *puVar10 = &PTR__SPxException_006a9ee8;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar10 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_58 = (DataKey)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"XLEAVE08 This should never happen.","");
      *puVar10 = &PTR__SPxException_006a9ee8;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_58,(undefined1 *)(local_50 + (long)local_58));
      *puVar10 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar10,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      if (dVar2 < *(double *)(in_FS_OFFSET + -8)) {
        (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
      }
      *newCoPrhs = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar12 = SUB84(pdVar8[lVar11],0);
      uVar13 = (undefined4)((ulong)pdVar8[lVar11] >> 0x20);
      break;
    case P_ON_UPPER:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      ::soplex::infinity::__tls_init();
      if (-*(double *)(in_FS_OFFSET + -8) < dVar2) {
        (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] =
             (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11];
      }
      *newCoPrhs = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar11];
      pdVar8 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *newUBbound = pdVar8[lVar11];
      dVar2 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar11];
      uVar12 = SUB84(dVar2,0);
      uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
      break;
    case P_FREE:
      SVar5 = SPxBasisBase<double>::dualColStatus(this_00,iVar4);
      (this->super_SPxBasisBase<double>).thedesc.colstat.data[lVar11] = SVar5;
      pVVar6 = &this->theLCbound;
      if (0.0 < leaveMax *
                (this->thePvec->thedelta).super_VectorBase<double>.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar11]) {
        pVVar6 = &this->theUCbound;
      }
      *newCoPrhs = (pVVar6->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11];
      *newUBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      *newLBbound = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11];
      *enterBound = 0.0;
      return;
    }
    *newLBbound = (double)CONCAT44(uVar13,uVar12);
    dVar2 = pdVar8[lVar11];
    *enterBound = dVar2;
    dVar2 = dVar2 * *newCoPrhs;
    dVar1 = objChange->sum;
    dVar14 = dVar1 - dVar2;
    objChange->c = (-dVar2 - (dVar14 - dVar1)) + (dVar1 - (dVar14 - (dVar14 - dVar1))) +
                   objChange->c;
  }
  objChange->sum = dVar14;
  return;
switchD_001c0d29_caseD_2:
  *newUBbound = 0.0;
  ::soplex::infinity::__tls_init();
  *newLBbound = -*(double *)(in_FS_OFFSET + -8);
  (this->super_SPxBasisBase<double>).thedesc.rowstat.data[lVar11] = P_ON_LOWER;
  pdVar8 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  goto LAB_001c12f8;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}